

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  FileReaderFactory defaultFactory;
  allocator<char> local_19d;
  EssenceType_t EssenceType;
  undefined1 local_198 [104];
  Result_t result;
  char *local_128;
  CommandOptions Options;
  string local_38 [32];
  
  Kumu::Result_t::Result_t(&result,(Result_t *)Kumu::RESULT_OK);
  CommandOptions::CommandOptions(&Options,argc,argv);
  if (Options.version_flag == true) {
    banner(_stdout);
  }
  if (Options.help_flag == true) {
    usage(_stdout);
  }
  iVar1 = 0;
  if ((Options.version_flag != false) || (Options.help_flag != false)) goto LAB_0010a19b;
  if (Options.error_flag == true) {
    fprintf(_stderr,"There was a problem. Type %s -h for help.\n","asdcp-unwrap");
    iVar1 = 3;
    goto LAB_0010a19b;
  }
  if (Options.mode == MMT_EXTRACT) {
    std::__cxx11::string::string<std::allocator<char>>(local_38,Options.input_filename,&local_19d);
    ASDCP::EssenceType((string *)local_198,(EssenceType_t *)local_38,
                       (IFileReaderFactory *)&EssenceType);
    Kumu::Result_t::operator=(&result,(Result_t *)local_198);
    Kumu::Result_t::~Result_t((Result_t *)local_198);
    std::__cxx11::string::~string(local_38);
    if (-1 < _result) {
      switch(EssenceType) {
      case ESS_MPEG2_VES:
        read_MPEG2_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      case ESS_JPEG_2000:
        if (Options.stereo_image_flag == true) {
          read_JP2K_S_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
          Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        }
        else {
          read_JP2K_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
          Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        }
        break;
      case ESS_PCM_24b_48k:
      case ESS_PCM_24b_96k:
        read_PCM_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      case ESS_TIMED_TEXT:
        read_timed_text_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      case ESS_JPEG_2000_S:
        read_JP2K_S_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      case ESS_DCDATA_UNKNOWN:
        read_DCData_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      case ESS_DCDATA_DOLBY_ATMOS:
        Options.extension = "atmos";
        read_DCData_file((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
        Kumu::Result_t::operator=(&result,(Result_t *)local_198);
        break;
      default:
        fprintf(_stderr,"%s: Unknown file type, not ASDCP essence.\n",Options.input_filename);
        iVar1 = 5;
        goto LAB_0010a19b;
      }
      goto LAB_0010a184;
    }
  }
  else {
    if (Options.mode != MMT_GOP_START) {
      fprintf(_stderr,"Unhandled mode: %d.\n");
      iVar1 = 6;
      goto LAB_0010a19b;
    }
    gop_start_test((CommandOptions *)local_198,(IFileReaderFactory *)&Options);
    Kumu::Result_t::operator=(&result,(Result_t *)local_198);
LAB_0010a184:
    Kumu::Result_t::~Result_t((Result_t *)local_198);
  }
  iVar1 = 0;
  if (_result < 0) {
    fputs("Program stopped on error.\n",_stderr);
    if (_result == ASDCP::RESULT_SFORMAT) {
      fputs("Use option \'-3\' to force stereoscopic mode.\n",_stderr);
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      if (_result != Kumu::RESULT_FAIL) {
        fputs(local_128,_stderr);
        fputc(10,_stderr);
      }
    }
  }
LAB_0010a19b:
  std::__cxx11::string::~string((string *)&Options.prefix_buffer);
  Kumu::Result_t::~Result_t(&result);
  return iVar1;
}

Assistant:

int
main(int argc, const char** argv)
{
  Result_t result = RESULT_OK;
  CommandOptions Options(argc, argv);

  if ( Options.version_flag )
    banner();

  if ( Options.help_flag )
    usage();

  if ( Options.version_flag || Options.help_flag )
    return 0;

  if ( Options.error_flag )
    {
      fprintf(stderr, "There was a problem. Type %s -h for help.\n", PROGRAM_NAME);
      return 3;
    }

  Kumu::FileReaderFactory defaultFactory;

  if ( Options.mode == MMT_GOP_START )
    {
      result = gop_start_test(Options, defaultFactory);
    }
  else if ( Options.mode == MMT_EXTRACT )
    {
      EssenceType_t EssenceType;
      result = ASDCP::EssenceType(Options.input_filename, EssenceType, defaultFactory);

      if ( ASDCP_SUCCESS(result) )
	{
	  switch ( EssenceType )
	    {
	    case ESS_MPEG2_VES:
          result = read_MPEG2_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000:
	      if ( Options.stereo_image_flag )
        result = read_JP2K_S_file(Options, defaultFactory);
	      else
        result = read_JP2K_file(Options, defaultFactory);
	      break;

	    case ESS_JPEG_2000_S:
          result = read_JP2K_S_file(Options, defaultFactory);
	      break;

	    case ESS_PCM_24b_48k:
	    case ESS_PCM_24b_96k:
          result = read_PCM_file(Options, defaultFactory);
	      break;

	    case ESS_TIMED_TEXT:
          result = read_timed_text_file(Options, defaultFactory);
	      break;

        case ESS_DCDATA_UNKNOWN:
          result = read_DCData_file(Options, defaultFactory);
          break;

        case ESS_DCDATA_DOLBY_ATMOS:
          Options.extension = "atmos";
          result = read_DCData_file(Options, defaultFactory);
          break;

	    default:
	      fprintf(stderr, "%s: Unknown file type, not ASDCP essence.\n", Options.input_filename);
	      return 5;
	    }
	}
    }
  else
    {
      fprintf(stderr, "Unhandled mode: %d.\n", Options.mode);
      return 6;
    }

  if ( ASDCP_FAILURE(result) )
    {
      fputs("Program stopped on error.\n", stderr);

      if ( result == RESULT_SFORMAT )
	{
	  fputs("Use option '-3' to force stereoscopic mode.\n", stderr);
	}
      else if ( result != RESULT_FAIL )
	{
	  fputs(result, stderr);
	  fputc('\n', stderr);
	}

      return 1;
    }

  return 0;
}